

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void collectCustomLayerNamesAndDescriptions
               (Model *model,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  uint32 uVar1;
  StringVector *pSVar2;
  SupportVectorClassifier *pSVar3;
  Rep *pRVar4;
  Type *pTVar5;
  Pipeline *pPVar6;
  int index;
  long lVar7;
  InternalMetadataWithArenaLite *pIVar8;
  void **ppvVar9;
  long lVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  uVar1 = model->_oneof_case_[0];
  if ((int)uVar1 < 0x12f) {
    if (uVar1 == 200) {
      pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
      if (pPVar6 == (Pipeline *)0x0) {
        pPVar6 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      pRVar4 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar9 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar9 = (void **)0x0;
      }
      lVar10 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar10 != 0) {
        lVar7 = 0;
        do {
          collectCustomLayerNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar7),output);
          lVar7 = lVar7 + 8;
        } while (lVar10 * 8 != lVar7);
      }
    }
    else if (uVar1 == 0xc9) {
      pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
      if (pPVar6 == (Pipeline *)0x0) {
        pPVar6 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      pRVar4 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar9 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar9 = (void **)0x0;
      }
      lVar10 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar10 != 0) {
        lVar7 = 0;
        do {
          collectCustomLayerNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar7),output);
          lVar7 = lVar7 + 8;
        } while (lVar10 * 8 != lVar7);
      }
    }
    else if (uVar1 == 0xca) {
      pSVar2 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
      pIVar8 = &pSVar2->_internal_metadata_;
      if (pSVar2 == (StringVector *)0x0) {
        pIVar8 = (InternalMetadataWithArenaLite *)0x0;
      }
      lVar10 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
      if (lVar10 != 0) {
        lVar7 = 0;
        do {
          collectCustomLayerNamesAndDescriptions
                    (*(Model **)
                      ((long)&(pIVar8->
                              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                              ).ptr_ + lVar7),output);
          lVar7 = lVar7 + 8;
        } while (lVar10 * 8 != lVar7);
      }
    }
  }
  else if ((((uVar1 == 0x12f) || (uVar1 == 0x193)) || (uVar1 == 500)) &&
          (pSVar3 = (model->Type_).supportvectorclassifier_,
          0 < *(int *)&(pSVar3->numberofsupportvectorsperclass_).rep_)) {
    index = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         ((RepeatedPtrFieldBase *)&pSVar3->numberofsupportvectorsperclass_,index);
      if (pTVar5->_oneof_case_[0] == 500) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((pTVar5->layer_).convolution_)->dilationfactor_).rep_,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    &((pTVar5->layer_).convolution_)->_dilationfactor_cached_byte_size_);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)output,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
          operator_delete(local_70.second._M_dataplus._M_p,
                          local_70.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
          operator_delete(local_70.first._M_dataplus._M_p,
                          local_70.first.field_2._M_allocated_capacity + 1);
        }
      }
      index = index + 1;
    } while (index < *(int *)&(pSVar3->numberofsupportvectorsperclass_).rep_);
  }
  return;
}

Assistant:

inline void collectCustomLayerNamesAndDescriptions(const Specification::Model &model, std::vector<StringPair> *output) {

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        default:
            auto layers = getNNSpec(model);
            if (layers) {
                for (int i =0; i< layers->size(); i++){
                    const Specification::NeuralNetworkLayer& layer = (*layers)[i];
                    if (layer.layer_case() == Specification::NeuralNetworkLayer::kCustom) {
                        output->push_back(std::make_pair(layer.custom().classname(), layer.custom().description()));
                    }
                }
            }
            break;
        }
}